

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O2

void __thiscall LiteScript::Memory::GarbageCollector(Memory *this,State *state)

{
  vector<const_LiteScript::State_*,_std::allocator<const_LiteScript::State_*>_> tmp;
  State *local_10;
  
  tmp.super__Vector_base<const_LiteScript::State_*,_std::allocator<const_LiteScript::State_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tmp.super__Vector_base<const_LiteScript::State_*,_std::allocator<const_LiteScript::State_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tmp.super__Vector_base<const_LiteScript::State_*,_std::allocator<const_LiteScript::State_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_10 = state;
  std::vector<LiteScript::State_const*,std::allocator<LiteScript::State_const*>>::
  emplace_back<LiteScript::State_const*>
            ((vector<LiteScript::State_const*,std::allocator<LiteScript::State_const*>> *)&tmp,
             &local_10);
  GarbageCollector(this,1,tmp.
                          super__Vector_base<const_LiteScript::State_*,_std::allocator<const_LiteScript::State_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  std::_Vector_base<const_LiteScript::State_*,_std::allocator<const_LiteScript::State_*>_>::
  ~_Vector_base(&tmp.
                 super__Vector_base<const_LiteScript::State_*,_std::allocator<const_LiteScript::State_*>_>
               );
  return;
}

Assistant:

void LiteScript::Memory::GarbageCollector(const State& state) {
    std::vector<const State *> tmp;
    tmp.push_back(&state);
    this->GarbageCollector(1, tmp.data());
}